

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O3

void do_counterfeit(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  OBJ_DATA *arg1_00;
  OBJ_DATA *obj;
  OBJ_AFFECT_DATA oaf;
  char arg2 [4608];
  char arg1 [4608];
  char hold [4608];
  OBJ_AFFECT_DATA local_3688;
  char local_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  iVar2 = get_skill(ch,(int)gsn_counterfeit);
  if (iVar2 == 0) {
    send_to_char("Huh?\n\r",ch);
    return;
  }
  pcVar4 = one_argument(argument,local_2438);
  one_argument(pcVar4,local_3638);
  if ((local_2438[0] == '\0') || (local_3638[0] == '\0')) {
    pcVar4 = "Syntax: counterfeit <original item> <base item for forgery>\n\r";
  }
  else {
    arg1_00 = get_obj_carry(ch,local_2438,ch);
    if (arg1_00 == (OBJ_DATA *)0x0) {
      pcVar4 = "You can\'t find the original item.\n\r";
    }
    else {
      obj = get_obj_carry(ch,local_3638,ch);
      if (obj == (OBJ_DATA *)0x0) {
        pcVar4 = "You can\'t find the copy item.\n\r";
      }
      else if (arg1_00->item_type == obj->item_type) {
        bVar1 = str_cmp(arg1_00->material,obj->material);
        if (!bVar1) {
          iVar3 = number_percent();
          if (iVar3 < iVar2) {
            act("You successfully counterfeit $p.",ch,arg1_00,(void *)0x0,3);
            free_pstring(obj->short_descr);
            pcVar4 = arg1_00->short_descr;
          }
          else {
            act("You botch the counterfeit and ruin $p!",ch,obj,(void *)0x0,3);
            free_pstring(obj->short_descr);
            pcVar4 = local_1238;
            sprintf(pcVar4,"a shoddy imitation of %s",arg1_00->short_descr);
          }
          pcVar4 = palloc_string(pcVar4);
          obj->short_descr = pcVar4;
          free_pstring(obj->name);
          pcVar4 = palloc_string(arg1_00->name);
          obj->name = pcVar4;
          free_pstring(obj->description);
          pcVar4 = palloc_string(arg1_00->description);
          obj->description = pcVar4;
          check_improve(ch,(int)gsn_counterfeit,iVar3 < iVar2,1);
          init_affect_obj(&local_3688);
          local_3688.where = 0;
          local_3688.type = gsn_counterfeit;
          local_3688.aftype = 1;
          local_3688.level = ch->level;
          local_3688.end_fun = counterfeit_end;
          local_3688.owner = ch;
          local_3688.duration = local_3688.level;
          affect_to_obj(obj,&local_3688);
          WAIT_STATE(ch,0x18);
          return;
        }
        pcVar4 = "Those two items are not even the same material.\n\r";
      }
      else {
        pcVar4 = "Even with your skill, you can\'t make those two look alike.\n\r";
      }
    }
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_counterfeit(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *orig, *copy;
	char arg1[MSL], arg2[MSL], hold[MSL];
	int skill;
	OBJ_AFFECT_DATA oaf;

	skill = get_skill(ch, gsn_counterfeit);

	if (skill == 0)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax: counterfeit <original item> <base item for forgery>\n\r", ch);
		return;
	}

	orig = get_obj_carry(ch, arg1, ch);

	if (orig == nullptr)
	{
		send_to_char("You can't find the original item.\n\r", ch);
		return;
	}

	copy = get_obj_carry(ch, arg2, ch);

	if (copy == nullptr)
	{
		send_to_char("You can't find the copy item.\n\r", ch);
		return;
	}

	if (orig->item_type != copy->item_type)
	{
		send_to_char("Even with your skill, you can't make those two look alike.\n\r", ch);
		return;
	}

	if (str_cmp(orig->material, copy->material))
	{
		send_to_char("Those two items are not even the same material.\n\r", ch);
		return;
	}

	if (number_percent() < skill)
	{
		act("You successfully counterfeit $p.", ch, orig, 0, TO_CHAR);

		free_pstring(copy->short_descr);
		copy->short_descr = palloc_string(orig->short_descr);

		free_pstring(copy->name);
		copy->name = palloc_string(orig->name);

		free_pstring(copy->description);
		copy->description = palloc_string(orig->description);

		check_improve(ch, gsn_counterfeit, true, 1);
	}
	else
	{
		act("You botch the counterfeit and ruin $p!", ch, copy, 0, TO_CHAR);

		free_pstring(copy->short_descr);
		sprintf(hold, "a shoddy imitation of %s", orig->short_descr);
		copy->short_descr = palloc_string(hold);

		free_pstring(copy->name);
		copy->name = palloc_string(orig->name);

		free_pstring(copy->description);
		copy->description = palloc_string(orig->description);

		check_improve(ch, gsn_counterfeit, false, 1);
	}

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = gsn_counterfeit;
	oaf.aftype = AFT_SKILL;
	oaf.level = ch->level;
	oaf.duration = ch->level;
	oaf.owner = ch;
	oaf.end_fun = counterfeit_end;
	affect_to_obj(copy, &oaf);

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}